

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenu::paintEvent(QMenu *this,QPaintEvent *e)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QMenuPrivate *pQVar5;
  QStyle *pQVar6;
  qsizetype qVar7;
  const_reference ppQVar8;
  const_reference pQVar9;
  QRect *pQVar10;
  ulong uVar11;
  QWidget *pQVar12;
  QPalette *pQVar13;
  QPaintEvent *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QRect QVar14;
  int i;
  int contentWidth;
  int bottommargin;
  int topmargin;
  int leftmargin;
  int vmargin;
  int hmargin;
  int fw;
  QMenuPrivate *d;
  QRegion borderReg;
  QRegion adjustedActionReg;
  QRect adjustedActionRect;
  QRect actionRect;
  QAction *action;
  QRect scrollUpTearOffRect;
  QRect tearOffRect;
  QRect scrollDownRect;
  QRect scrollUpRect;
  QRegion emptyArea;
  QStylePainter p;
  QStyleOptionFrame frame;
  QStyleOptionMenuItem opt;
  QStyleOptionMenuItem menuOpt;
  int in_stack_fffffffffffffc88;
  StateFlag in_stack_fffffffffffffc8c;
  QMenuPrivate *in_stack_fffffffffffffc90;
  QStyleOptionMenuItem *this_00;
  QWidget *in_stack_fffffffffffffc98;
  QRegion *this_01;
  QWidget *in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcac;
  int local_300;
  QRect local_2c8;
  QRect local_2b8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  QRegion local_250;
  QRegion local_248;
  QRegion local_240;
  QRegion local_238;
  undefined1 *local_230;
  undefined8 local_228;
  QRegion local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  QAction *local_208;
  undefined1 local_1fc [16];
  undefined1 *local_1ec;
  undefined1 *local_1e4;
  undefined1 *local_1dc;
  undefined1 *local_1d4;
  undefined1 *local_1cc;
  undefined1 *local_1c4;
  Int local_1bc;
  QRect local_1b8;
  QRegion local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  undefined1 local_188 [16];
  undefined8 local_178;
  undefined8 local_170;
  QPalette QStack_160;
  undefined4 local_148;
  undefined4 local_144;
  undefined1 local_138 [16];
  undefined1 *local_128;
  undefined8 local_120;
  QStyleOptionMenuItem local_a0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QMenu *)0x649d7e);
  QMenuPrivate::updateActionRects
            ((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  local_1a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_198 = &DAT_aaaaaaaaaaaaaaaa;
  local_190 = &DAT_aaaaaaaaaaaaaaaa;
  QStylePainter::QStylePainter((QStylePainter *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98)
  ;
  local_1a8.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  local_1b8 = QWidget::rect((QWidget *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8)
                           );
  QRegion::QRegion(&local_1a8,(QRect *)&local_1b8,Rectangle);
  memset(&local_a0,0xaa,0x98);
  QStyleOptionMenuItem::QStyleOptionMenuItem((QStyleOptionMenuItem *)0x649e36);
  QStyleOption::initFrom
            ((QStyleOption *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
             in_stack_fffffffffffffca0);
  QFlags<QStyle::StateFlag>::QFlags
            ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
  local_a0.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)local_1bc;
  local_a0.checkType = NotCheckable;
  local_a0.maxIconWidth = 0;
  local_a0.reservedShortcutWidth = 0;
  QStylePainter::drawPrimitive
            ((QStylePainter *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
             (QStyleOption *)0x649ea0);
  pQVar6 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  iVar2 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x1e,0,in_RDI);
  pQVar6 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x1c,0,in_RDI);
  pQVar6 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x1d,0,in_RDI);
  local_1cc = &DAT_aaaaaaaaaaaaaaaa;
  local_1c4 = &DAT_aaaaaaaaaaaaaaaa;
  QRect::QRect((QRect *)in_stack_fffffffffffffc90);
  local_1dc = &DAT_aaaaaaaaaaaaaaaa;
  local_1d4 = &DAT_aaaaaaaaaaaaaaaa;
  QRect::QRect((QRect *)in_stack_fffffffffffffc90);
  QWidget::width((QWidget *)0x649fed);
  if (pQVar5->scroll != (QMenuScroller *)0x0) {
    if ((pQVar5->scroll->scrollFlags & 1) != 0) {
      QMenuPrivate::scrollerHeight(in_stack_fffffffffffffc90);
      QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                     (int)((ulong)in_stack_fffffffffffffca0 >> 0x20),(int)in_stack_fffffffffffffca0,
                     (int)((ulong)in_stack_fffffffffffffc98 >> 0x20),(int)in_stack_fffffffffffffc98)
      ;
    }
    if ((pQVar5->scroll->scrollFlags & 2) != 0) {
      QWidget::height((QWidget *)0x64a0cd);
      QMenuPrivate::scrollerHeight(in_stack_fffffffffffffc90);
      QMenuPrivate::scrollerHeight(in_stack_fffffffffffffc90);
      QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                     (int)((ulong)in_stack_fffffffffffffca0 >> 0x20),(int)in_stack_fffffffffffffca0,
                     (int)((ulong)in_stack_fffffffffffffc98 >> 0x20),(int)in_stack_fffffffffffffc98)
      ;
    }
  }
  local_1ec = &DAT_aaaaaaaaaaaaaaaa;
  local_1e4 = &DAT_aaaaaaaaaaaaaaaa;
  QRect::QRect((QRect *)in_stack_fffffffffffffc90);
  if ((*(ushort *)&pQVar5->field_0x420 >> 9 & 1) != 0) {
    pQVar6 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)
                           );
    (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x1f,0,in_RDI);
    QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                   (int)((ulong)in_stack_fffffffffffffca0 >> 0x20),(int)in_stack_fffffffffffffca0,
                   (int)((ulong)in_stack_fffffffffffffc98 >> 0x20),(int)in_stack_fffffffffffffc98);
    if ((pQVar5->scroll != (QMenuScroller *)0x0) && ((pQVar5->scroll->scrollFlags & 1) != 0)) {
      QMenuPrivate::scrollerHeight(in_stack_fffffffffffffc90);
      QRect::translate((QRect *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                       in_stack_fffffffffffffc88);
    }
  }
  local_1fc._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_1fc._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_1fc = (undefined1  [16])
              QRect::united((QRect *)in_stack_fffffffffffffc90,
                            (QRect *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  local_300 = 0;
  do {
    qVar7 = QList<QAction_*>::size(&(pQVar5->super_QWidgetPrivate).actions);
    if (qVar7 <= local_300) {
      QRegion::QRegion(&local_240,(QRect *)local_1fc,Rectangle);
      QRegion::operator-=(&local_1a8,(QRegion *)&local_240);
      QRegion::~QRegion(&local_240);
      QRegion::QRegion(&local_248,(QRect *)&local_1dc,Rectangle);
      QRegion::operator-=(&local_1a8,(QRegion *)&local_248);
      QRegion::~QRegion(&local_248);
      if ((pQVar5->scrollUpTearOffItem == (ScrollerTearOffItem *)0x0) &&
         (pQVar5->scrollDownItem == (ScrollerTearOffItem *)0x0)) {
        QMenuPrivate::drawScroller
                  ((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                   (QPainter *)in_stack_fffffffffffffca0,
                   (Type)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                   (QRect *)in_stack_fffffffffffffc90);
        QMenuPrivate::drawScroller
                  ((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                   (QPainter *)in_stack_fffffffffffffca0,
                   (Type)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                   (QRect *)in_stack_fffffffffffffc90);
        QMenuPrivate::drawTearOff
                  ((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                   (QPainter *)in_stack_fffffffffffffca0,(QRect *)in_stack_fffffffffffffc98);
      }
      else {
        if (pQVar5->scrollUpTearOffItem != (ScrollerTearOffItem *)0x0) {
          QMenuPrivate::ScrollerTearOffItem::updateScrollerRects
                    ((ScrollerTearOffItem *)in_stack_fffffffffffffc90,
                     (QRect *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        }
        if (pQVar5->scrollDownItem != (ScrollerTearOffItem *)0x0) {
          QMenuPrivate::ScrollerTearOffItem::updateScrollerRects
                    ((ScrollerTearOffItem *)in_stack_fffffffffffffc90,
                     (QRect *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        }
      }
      if (iVar2 != 0) {
        local_250.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QRegion::QRegion(&local_250);
        in_stack_fffffffffffffca8 = iVar2;
        QWidget::height((QWidget *)0x64a78b);
        QRect::QRect((QRect *)in_stack_fffffffffffffc98,
                     (int)((ulong)in_stack_fffffffffffffc90 >> 0x20),(int)in_stack_fffffffffffffc90,
                     in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88);
        QRegion::operator+=(&local_250,(QRect *)local_260);
        in_stack_fffffffffffffcac = QWidget::width((QWidget *)0x64a7c2);
        in_stack_fffffffffffffcac = in_stack_fffffffffffffcac - iVar2;
        QWidget::height((QWidget *)0x64a7e2);
        QRect::QRect((QRect *)in_stack_fffffffffffffc98,
                     (int)((ulong)in_stack_fffffffffffffc90 >> 0x20),(int)in_stack_fffffffffffffc90,
                     in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88);
        QRegion::operator+=(&local_250,(QRect *)local_270);
        QWidget::width((QWidget *)0x64a81b);
        QRect::QRect((QRect *)in_stack_fffffffffffffc98,
                     (int)((ulong)in_stack_fffffffffffffc90 >> 0x20),(int)in_stack_fffffffffffffc90,
                     in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88);
        QRegion::operator+=(&local_250,(QRect *)local_280);
        QWidget::height((QWidget *)0x64a855);
        QWidget::width((QWidget *)0x64a86a);
        QRect::QRect((QRect *)in_stack_fffffffffffffc98,
                     (int)((ulong)in_stack_fffffffffffffc90 >> 0x20),(int)in_stack_fffffffffffffc90,
                     in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88);
        QRegion::operator+=(&local_250,(QRect *)local_290);
        QPainter::setClipRegion((QRegion *)&local_1a0,(ClipOperation)&local_250);
        QRegion::operator-=(&local_1a8,(QRegion *)&local_250);
        memset(local_188,0xaa,0x50);
        QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)0x64a8ef);
        QVar14 = QWidget::rect((QWidget *)
                               CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        local_2a0 = QVar14._0_8_;
        local_178 = local_2a0;
        local_298 = QVar14._8_8_;
        local_170 = local_298;
        pQVar13 = QWidget::palette((QWidget *)in_stack_fffffffffffffc90);
        QPalette::operator=(&QStack_160,(QPalette *)pQVar13);
        QFlags<QStyle::StateFlag>::QFlags
                  ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c)
        ;
        pQVar6 = QWidget::style((QWidget *)
                                CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        local_148 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x1e,local_188,in_RDI);
        local_144 = 0;
        QStylePainter::drawPrimitive
                  ((QStylePainter *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                   (QStyleOption *)0x64a9b8);
        QStyleOptionFrame::~QStyleOptionFrame((QStyleOptionFrame *)0x64a9c5);
        QRegion::~QRegion(&local_250);
      }
      this_01 = &local_1a8;
      QPainter::setClipRegion((QRegion *)&local_1a0,(ClipOperation)this_01);
      QFlags<QStyle::StateFlag>::QFlags
                ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
      local_a0.menuItemType = EmptyArea;
      local_a0.checkType = NotCheckable;
      QVar14 = QWidget::rect((QWidget *)
                             CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      local_2b8._0_8_ = QVar14._0_8_;
      local_2b8._8_8_ = QVar14._8_8_;
      local_a0.super_QStyleOption.rect.x1.m_i = local_2b8.x1.m_i;
      local_a0.super_QStyleOption.rect.y1.m_i = local_2b8.y1.m_i;
      local_a0.super_QStyleOption.rect.x2.m_i = local_2b8.x2.m_i;
      local_a0.super_QStyleOption.rect.y2.m_i = local_2b8.y2.m_i;
      QVar14 = QWidget::rect((QWidget *)
                             CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      local_2c8._0_8_ = QVar14._0_8_;
      local_2c8._8_8_ = QVar14._8_8_;
      local_a0.menuRect.x1.m_i = local_2c8.x1.m_i;
      local_a0.menuRect.y1.m_i = local_2c8.y1.m_i;
      local_a0.menuRect.x2.m_i = local_2c8.x2.m_i;
      local_a0.menuRect.y2.m_i = local_2c8.y2.m_i;
      this_00 = &local_a0;
      QStylePainter::drawControl
                ((QStylePainter *)this_00,in_stack_fffffffffffffc8c,(QStyleOption *)0x64aa99);
      QStyleOptionMenuItem::~QStyleOptionMenuItem(this_00);
      QRegion::~QRegion(this_01);
      QStylePainter::~QStylePainter((QStylePainter *)0x64aab7);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    ppQVar8 = QList<QAction_*>::at
                        ((QList<QAction_*> *)in_stack_fffffffffffffc90,
                         CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    local_208 = *ppQVar8;
    local_218 = &DAT_aaaaaaaaaaaaaaaa;
    local_210 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar9 = QList<QRect>::at((QList<QRect> *)in_stack_fffffffffffffc90,
                              CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    local_218 = *(undefined1 **)pQVar9;
    local_210._0_4_ = pQVar9->x2;
    local_210._4_4_ = pQVar9->y2;
    pQVar10 = QPaintEvent::rect(in_RSI);
    uVar11 = QRect::intersects((QRect *)pQVar10);
    if (((uVar11 & 1) != 0) &&
       (pQVar12 = QHash<QAction_*,_QWidget_*>::value
                            ((QHash<QAction_*,_QWidget_*> *)in_stack_fffffffffffffc98,
                             (QAction **)in_stack_fffffffffffffc90), pQVar12 == (QWidget *)0x0)) {
      QRegion::QRegion(&local_220,(QRect *)&local_218,Rectangle);
      QRegion::operator-=(&local_1a8,(QRegion *)&local_220);
      QRegion::~QRegion(&local_220);
      local_230 = local_218;
      local_228 = local_210;
      bVar1 = QRect::isEmpty((QRect *)in_stack_fffffffffffffc90);
      if (!bVar1) {
        iVar3 = QRect::bottom((QRect *)0x64a3e4);
        iVar4 = QRect::top((QRect *)0x64a3f5);
        if (iVar3 <= iVar4) goto LAB_0064a5ea;
      }
      bVar1 = QRect::isEmpty((QRect *)in_stack_fffffffffffffc90);
      if (!bVar1) {
        iVar3 = QRect::top((QRect *)0x64a422);
        iVar4 = QRect::bottom((QRect *)0x64a433);
        if (iVar4 <= iVar3) goto LAB_0064a5ea;
      }
      uVar11 = QRect::intersects((QRect *)&local_230);
      if ((uVar11 & 1) != 0) {
        iVar3 = QRect::bottom((QRect *)0x64a46a);
        iVar4 = QRect::bottom((QRect *)0x64a47b);
        if (iVar3 <= iVar4) goto LAB_0064a5ea;
        QRect::bottom((QRect *)0x64a497);
        QRect::setTop((QRect *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
      }
      uVar11 = QRect::intersects((QRect *)&local_230);
      if ((uVar11 & 1) != 0) {
        iVar3 = QRect::top((QRect *)0x64a4d3);
        iVar4 = QRect::top((QRect *)0x64a4e4);
        if (iVar4 <= iVar3) goto LAB_0064a5ea;
        QRect::top((QRect *)0x64a500);
        QRect::setBottom((QRect *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
      }
      local_238.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion(&local_238,(QRect *)&local_230,Rectangle);
      QPainter::setClipRegion((QRegion *)&local_1a0,(ClipOperation)&local_238);
      memset(local_138,0xaa,0x98);
      QStyleOptionMenuItem::QStyleOptionMenuItem((QStyleOptionMenuItem *)0x64a578);
      (**(code **)(*in_RDI + 0x1a0))(in_RDI,local_138,local_208);
      local_128 = local_218;
      local_120 = local_210;
      QStylePainter::drawControl
                ((QStylePainter *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                 (QStyleOption *)0x64a5d0);
      QStyleOptionMenuItem::~QStyleOptionMenuItem((QStyleOptionMenuItem *)in_stack_fffffffffffffc90)
      ;
      QRegion::~QRegion(&local_238);
    }
LAB_0064a5ea:
    local_300 = local_300 + 1;
  } while( true );
}

Assistant:

void QMenu::paintEvent(QPaintEvent *e)
{
    Q_D(QMenu);
    d->updateActionRects();
    QStylePainter p(this);
    QRegion emptyArea = QRegion(rect());

    QStyleOptionMenuItem menuOpt;
    menuOpt.initFrom(this);
    menuOpt.state = QStyle::State_None;
    menuOpt.checkType = QStyleOptionMenuItem::NotCheckable;
    menuOpt.maxIconWidth = 0;
    menuOpt.reservedShortcutWidth = 0;
    p.drawPrimitive(QStyle::PE_PanelMenu, menuOpt);

    //calculate the scroll up / down rect
    const int fw = style()->pixelMetric(QStyle::PM_MenuPanelWidth, nullptr, this);
    const int hmargin = style()->pixelMetric(QStyle::PM_MenuHMargin,nullptr, this);
    const int vmargin = style()->pixelMetric(QStyle::PM_MenuVMargin, nullptr, this);

    QRect scrollUpRect, scrollDownRect;
    const int leftmargin = fw + hmargin + d->leftmargin;
    const int topmargin = fw + vmargin + d->topmargin;
    const int bottommargin = fw + vmargin + d->bottommargin;
    const int contentWidth = width() - (fw + hmargin) * 2 - d->leftmargin - d->rightmargin;
    if (d->scroll) {
        if (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
            scrollUpRect.setRect(leftmargin, topmargin, contentWidth, d->scrollerHeight());

        if (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollDown)
            scrollDownRect.setRect(leftmargin, height() - d->scrollerHeight() - bottommargin,
                                   contentWidth, d->scrollerHeight());
    }

    //calculate the tear off rect
    QRect tearOffRect;
    if (d->tearoff) {
        tearOffRect.setRect(leftmargin, topmargin, contentWidth,
                            style()->pixelMetric(QStyle::PM_MenuTearoffHeight, nullptr, this));
        if (d->scroll && d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
            tearOffRect.translate(0, d->scrollerHeight());
    }

    //draw the items that need updating..
    QRect scrollUpTearOffRect = scrollUpRect.united(tearOffRect);
    for (int i = 0; i < d->actions.size(); ++i) {
        QAction *action = d->actions.at(i);
        QRect actionRect = d->actionRects.at(i);
        if (!e->rect().intersects(actionRect)
            || d->widgetItems.value(action))
           continue;
        //set the clip region to be extra safe (and adjust for the scrollers)
        emptyArea -= QRegion(actionRect);

        QRect adjustedActionRect = actionRect;
        if (!scrollUpTearOffRect.isEmpty() && adjustedActionRect.bottom() <= scrollUpTearOffRect.top())
            continue;

        if (!scrollDownRect.isEmpty() && adjustedActionRect.top() >=  scrollDownRect.bottom())
            continue;

        if (adjustedActionRect.intersects(scrollUpTearOffRect)) {
            if (adjustedActionRect.bottom() <= scrollUpTearOffRect.bottom())
                continue;
            else
                adjustedActionRect.setTop(scrollUpTearOffRect.bottom()+1);
        }

        if (adjustedActionRect.intersects(scrollDownRect)) {
            if (adjustedActionRect.top() >= scrollDownRect.top())
                continue;
            else
                adjustedActionRect.setBottom(scrollDownRect.top()-1);
        }

        QRegion adjustedActionReg(adjustedActionRect);
        p.setClipRegion(adjustedActionReg);

        QStyleOptionMenuItem opt;
        initStyleOption(&opt, action);
        opt.rect = actionRect;
        p.drawControl(QStyle::CE_MenuItem, opt);
    }

    emptyArea -= QRegion(scrollUpTearOffRect);
    emptyArea -= QRegion(scrollDownRect);

    if (d->scrollUpTearOffItem || d->scrollDownItem) {
        if (d->scrollUpTearOffItem)
            d->scrollUpTearOffItem->updateScrollerRects(scrollUpTearOffRect);
        if (d->scrollDownItem)
            d->scrollDownItem->updateScrollerRects(scrollDownRect);
    } else {
        //paint scroll up /down
        d->drawScroller(&p, QMenuPrivate::ScrollerTearOffItem::ScrollUp, scrollUpRect);
        d->drawScroller(&p, QMenuPrivate::ScrollerTearOffItem::ScrollDown, scrollDownRect);
        //paint the tear off..
        d->drawTearOff(&p, tearOffRect);
    }

    //draw border
    if (fw) {
        QRegion borderReg;
        borderReg += QRect(0, 0, fw, height()); //left
        borderReg += QRect(width()-fw, 0, fw, height()); //right
        borderReg += QRect(0, 0, width(), fw); //top
        borderReg += QRect(0, height()-fw, width(), fw); //bottom
        p.setClipRegion(borderReg);
        emptyArea -= borderReg;
        QStyleOptionFrame frame;
        frame.rect = rect();
        frame.palette = palette();
        frame.state = QStyle::State_None;
        frame.lineWidth = style()->pixelMetric(QStyle::PM_MenuPanelWidth, &frame, this);
        frame.midLineWidth = 0;
        p.drawPrimitive(QStyle::PE_FrameMenu, frame);
    }

    //finally the rest of the spaces
    p.setClipRegion(emptyArea);
    menuOpt.state = QStyle::State_None;
    menuOpt.menuItemType = QStyleOptionMenuItem::EmptyArea;
    menuOpt.checkType = QStyleOptionMenuItem::NotCheckable;
    menuOpt.rect = rect();
    menuOpt.menuRect = rect();
    p.drawControl(QStyle::CE_MenuEmptyArea, menuOpt);
}